

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O2

void av1_warp_affine_c(int32_t *mat,uint8_t *ref,int width,int height,int stride,uint8_t *pred,
                      int p_col,int p_row,int p_width,int p_height,int p_stride,int subsampling_x,
                      int subsampling_y,ConvolveParams *conv_params,int16_t alpha,int16_t beta,
                      int16_t gamma,int16_t delta)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  byte bVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  char cVar21;
  int m_1;
  long lVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int aiStack_218 [122];
  
  bVar1 = (byte)conv_params->round_0;
  if (conv_params->is_compound == 0) {
    bVar13 = 0xe - bVar1;
    bVar7 = (byte)conv_params->round_1;
  }
  else {
    bVar13 = (byte)conv_params->round_1;
    bVar7 = bVar13;
  }
  bVar7 = 0xe - (bVar7 + bVar1);
  iVar17 = (1 << (bVar13 & 0x1f)) >> 1;
  iVar11 = p_row;
  while( true ) {
    iVar2 = (p_height + p_row) - iVar11;
    if (iVar2 == 0 || p_height + p_row < iVar11) break;
    lVar12 = (long)(iVar11 + 4 << ((byte)subsampling_y & 0x1f));
    iVar8 = iVar2 + -4;
    if (8 < iVar2) {
      iVar8 = 4;
    }
    iVar2 = p_col;
    while( true ) {
      iVar3 = (p_width + p_col) - iVar2;
      if (iVar3 == 0 || p_width + p_col < iVar2) break;
      lVar5 = (long)(iVar2 + 4 << ((byte)subsampling_x & 0x1f));
      lVar22 = (long)*mat + mat[3] * lVar12 + mat[2] * lVar5 >> ((byte)subsampling_x & 0x3f);
      lVar15 = (long)mat[1] + mat[5] * lVar12 + mat[4] * lVar5 >> ((byte)subsampling_y & 0x3f);
      for (lVar5 = -7; lVar5 != 8; lVar5 = lVar5 + 1) {
        lVar6 = (int)((ulong)lVar15 >> 0x10) + lVar5;
        iVar14 = (int)lVar6;
        iVar4 = height + -1;
        if (iVar14 < height + -1) {
          iVar4 = iVar14;
        }
        if (lVar6 < 0) {
          iVar4 = 0;
        }
        iVar24 = ((int)lVar5 + 4) * (int)beta +
                 (((uint)lVar22 & 0xfffc) + ((int)beta + (int)alpha) * -4 & 0xffffffc0);
        iVar14 = (int)((ulong)lVar22 >> 0x10) + -7;
        for (lVar6 = -4; lVar6 != 4; lVar6 = lVar6 + 1) {
          iVar20 = 0x4000;
          for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 1) {
            iVar23 = iVar14 + (int)lVar16;
            if (width + -1 <= iVar23) {
              iVar23 = width + -1;
            }
            if (iVar14 + lVar16 < 0) {
              iVar23 = 0;
            }
            iVar20 = iVar20 + (int)*(short *)((long)(iVar24 + 0x200 >> 10) * 0x10 + 0x4bfc60 +
                                             lVar16 * 2) * (uint)ref[iVar23 + iVar4 * stride];
          }
          aiStack_218[lVar5 * 8 + 0x3c + lVar6] =
               iVar20 + ((1 << (bVar1 & 0x1f)) >> 1) >> (bVar1 & 0x1f);
          iVar24 = iVar24 + alpha;
          iVar14 = iVar14 + 1;
        }
      }
      iVar4 = iVar3 + -4;
      if (8 < iVar3) {
        iVar4 = 4;
      }
      iVar3 = (iVar2 - p_col) + 4;
      iVar14 = 0;
      for (lVar5 = -4; lVar5 < iVar8; lVar5 = lVar5 + 1) {
        iVar25 = (iVar11 - p_row) + 4 + (int)lVar5;
        iVar20 = iVar25 * p_stride;
        iVar23 = ((int)lVar5 + 4) * (int)delta +
                 (((uint)lVar15 & 0xfffc) + ((int)delta + (int)gamma) * -4 & 0xffffffc0);
        iVar24 = iVar14;
        for (lVar22 = -4; lVar22 < iVar4; lVar22 = lVar22 + 1) {
          iVar18 = 1 << (0x16 - bVar1 & 0x1f);
          iVar9 = iVar24;
          for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
            iVar18 = iVar18 + (int)*(short *)((long)(iVar23 + 0x200 >> 10) * 0x10 + 0x4bfc60 +
                                             lVar6 * 2) * aiStack_218[iVar9];
            iVar9 = iVar9 + 8;
          }
          if (conv_params->is_compound == 0) {
            iVar9 = iVar18 + iVar17 >> (bVar13 & 0x1f);
            if (iVar9 < 0x181) {
              iVar9 = 0x180;
            }
            uVar10 = iVar9 - 0x180U;
            if (0xfe < iVar9 - 0x180U) {
              uVar10 = 0xff;
            }
            pred[iVar3 + iVar20 + (int)lVar22] = (uint8_t)uVar10;
          }
          else {
            iVar9 = iVar3 + (int)lVar22;
            iVar19 = iVar18 + iVar17 >> (bVar13 & 0x1f);
            iVar18 = conv_params->dst_stride * iVar25 + iVar9;
            if (conv_params->do_average == 0) {
              conv_params->dst[iVar18] = (CONV_BUF_TYPE)iVar19;
            }
            else {
              uVar10 = (uint)conv_params->dst[iVar18];
              if (conv_params->use_dist_wtd_comp_avg == 0) {
                iVar18 = (int)(iVar19 + uVar10) >> 1;
              }
              else {
                iVar18 = (int)(iVar19 * conv_params->bck_offset + uVar10 * conv_params->fwd_offset)
                         >> 4;
              }
              cVar21 = (char)conv_params->round_1 + bVar1;
              iVar18 = (-1 << (0x15U - cVar21 & 0x1f)) +
                       (-1 << (0x16U - cVar21 & 0x1f)) + ((1 << (bVar7 & 0x1f)) >> 1) + iVar18 >>
                       (bVar7 & 0x1f);
              if (iVar18 < 1) {
                iVar18 = 0;
              }
              if (0xfe < iVar18) {
                iVar18 = 0xff;
              }
              pred[iVar9 + iVar20] = (uint8_t)iVar18;
            }
          }
          iVar23 = iVar23 + gamma;
          iVar24 = iVar24 + 1;
        }
        iVar14 = iVar14 + 8;
      }
      iVar2 = iVar2 + 8;
    }
    iVar11 = iVar11 + 8;
  }
  return;
}

Assistant:

void av1_warp_affine_c(const int32_t *mat, const uint8_t *ref, int width,
                       int height, int stride, uint8_t *pred, int p_col,
                       int p_row, int p_width, int p_height, int p_stride,
                       int subsampling_x, int subsampling_y,
                       ConvolveParams *conv_params, int16_t alpha, int16_t beta,
                       int16_t gamma, int16_t delta) {
  int32_t tmp[15 * 8];
  const int bd = 8;
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int max_bits_horiz = bd + FILTER_BITS + 1 - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  (void)max_bits_horiz;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));
  assert(IMPLIES(conv_params->do_average, conv_params->is_compound));

  for (int i = p_row; i < p_row + p_height; i += 8) {
    for (int j = p_col; j < p_col + p_width; j += 8) {
      // Calculate the center of this 8x8 block,
      // project to luma coordinates (if in a subsampled chroma plane),
      // apply the affine transformation,
      // then convert back to the original coordinates (if necessary)
      const int32_t src_x = (j + 4) << subsampling_x;
      const int32_t src_y = (i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      int32_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      int32_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      sx4 += alpha * (-4) + beta * (-4);
      sy4 += gamma * (-4) + delta * (-4);

      sx4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);
      sy4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);

      // Horizontal filter
      for (int k = -7; k < 8; ++k) {
        // Clamp to top/bottom edge of the frame
        const int iy = clamp(iy4 + k, 0, height - 1);

        int sx = sx4 + beta * (k + 4);

        for (int l = -4; l < 4; ++l) {
          int ix = ix4 + l - 3;
          // At this point, sx = sx4 + alpha * l + beta * k
          const int offs = ROUND_POWER_OF_TWO(sx, WARPEDDIFF_PREC_BITS) +
                           WARPEDPIXEL_PREC_SHIFTS;
          assert(offs >= 0 && offs <= WARPEDPIXEL_PREC_SHIFTS * 3);
          const WarpedFilterCoeff *coeffs = av1_warped_filter[offs];

          int32_t sum = 1 << offset_bits_horiz;
          for (int m = 0; m < 8; ++m) {
            // Clamp to left/right edge of the frame
            const int sample_x = clamp(ix + m, 0, width - 1);

            sum += ref[iy * stride + sample_x] * coeffs[m];
          }
          sum = ROUND_POWER_OF_TWO(sum, reduce_bits_horiz);
          assert(0 <= sum && sum < (1 << max_bits_horiz));
          tmp[(k + 7) * 8 + (l + 4)] = sum;
          sx += alpha;
        }
      }

      // Vertical filter
      for (int k = -4; k < AOMMIN(4, p_row + p_height - i - 4); ++k) {
        int sy = sy4 + delta * (k + 4);
        for (int l = -4; l < AOMMIN(4, p_col + p_width - j - 4); ++l) {
          // At this point, sy = sy4 + gamma * l + delta * k
          const int offs = ROUND_POWER_OF_TWO(sy, WARPEDDIFF_PREC_BITS) +
                           WARPEDPIXEL_PREC_SHIFTS;
          assert(offs >= 0 && offs <= WARPEDPIXEL_PREC_SHIFTS * 3);
          const WarpedFilterCoeff *coeffs = av1_warped_filter[offs];

          int32_t sum = 1 << offset_bits_vert;
          for (int m = 0; m < 8; ++m) {
            sum += tmp[(k + m + 4) * 8 + (l + 4)] * coeffs[m];
          }

          if (conv_params->is_compound) {
            CONV_BUF_TYPE *p =
                &conv_params
                     ->dst[(i - p_row + k + 4) * conv_params->dst_stride +
                           (j - p_col + l + 4)];
            sum = ROUND_POWER_OF_TWO(sum, reduce_bits_vert);
            if (conv_params->do_average) {
              uint8_t *dst8 =
                  &pred[(i - p_row + k + 4) * p_stride + (j - p_col + l + 4)];
              int32_t tmp32 = *p;
              if (conv_params->use_dist_wtd_comp_avg) {
                tmp32 = tmp32 * conv_params->fwd_offset +
                        sum * conv_params->bck_offset;
                tmp32 = tmp32 >> DIST_PRECISION_BITS;
              } else {
                tmp32 += sum;
                tmp32 = tmp32 >> 1;
              }
              tmp32 = tmp32 - (1 << (offset_bits - conv_params->round_1)) -
                      (1 << (offset_bits - conv_params->round_1 - 1));
              *dst8 = clip_pixel(ROUND_POWER_OF_TWO(tmp32, round_bits));
            } else {
              *p = sum;
            }
          } else {
            uint8_t *p =
                &pred[(i - p_row + k + 4) * p_stride + (j - p_col + l + 4)];
            sum = ROUND_POWER_OF_TWO(sum, reduce_bits_vert);
            assert(0 <= sum && sum < (1 << (bd + 2)));
            *p = clip_pixel(sum - (1 << (bd - 1)) - (1 << bd));
          }
          sy += gamma;
        }
      }
    }
  }
}